

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

CoinSelectionOption * GetBitcoinOption(void)

{
  CoinSelectionOption *in_RDI;
  CoinSelectionOption *option;
  CoinSelectionOption *in_stack_00000130;
  
  cfd::CoinSelectionOption::CoinSelectionOption(in_RDI);
  cfd::CoinSelectionOption::InitializeTxSizeInfo(in_stack_00000130);
  return in_RDI;
}

Assistant:

static CoinSelectionOption GetBitcoinOption() {
  CoinSelectionOption option;
  option.InitializeTxSizeInfo();
  return option;
}